

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

void ucnv_setFromUCallBack_63
               (UConverter *converter,UConverterFromUCallback newAction,void *newContext,
               UConverterFromUCallback *oldAction,void **oldContext,UErrorCode *err)

{
  UBool UVar1;
  UErrorCode *err_local;
  void **oldContext_local;
  UConverterFromUCallback *oldAction_local;
  void *newContext_local;
  UConverterFromUCallback newAction_local;
  UConverter *converter_local;
  
  UVar1 = U_FAILURE(*err);
  if (UVar1 == '\0') {
    if (oldAction != (UConverterFromUCallback *)0x0) {
      *oldAction = converter->fromUCharErrorBehaviour;
    }
    converter->fromUCharErrorBehaviour = newAction;
    if (oldContext != (void **)0x0) {
      *oldContext = converter->fromUContext;
    }
    converter->fromUContext = newContext;
  }
  return;
}

Assistant:

U_CAPI void  U_EXPORT2
ucnv_setFromUCallBack (UConverter * converter,
                            UConverterFromUCallback newAction,
                            const void* newContext,
                            UConverterFromUCallback *oldAction,
                            const void** oldContext,
                            UErrorCode * err)
{
    if (U_FAILURE (*err))
        return;
    if (oldAction) *oldAction = converter->fromUCharErrorBehaviour;
    converter->fromUCharErrorBehaviour = newAction;
    if (oldContext) *oldContext = converter->fromUContext;
    converter->fromUContext = newContext;
}